

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O2

serialData * __thiscall
MinVR::VRDataQueue::serialize_abi_cxx11_(serialData *__return_storage_ptr__,VRDataQueue *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream timeStamp;
  ostringstream lenStr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&lenStr);
  std::ostream::_M_insert<unsigned_long>((ulong)&lenStr);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::operator+(&local_3c0,"<VRDataQueue num=\"",&local_3e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&timeStamp,
                 &local_3c0,"\">");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&timeStamp);
  std::__cxx11::string::~string((string *)&timeStamp);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  for (p_Var2 = (this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->_dataMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&timeStamp);
    poVar1 = std::ostream::_M_insert<long_long>((longlong)&timeStamp);
    poVar1 = std::operator<<(poVar1,"-");
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
    std::ostream::operator<<(poVar1,*(int *)&p_Var2[1]._M_parent);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_360,"<VRDataQueueItem timeStamp=\"",&local_3a0);
    std::operator+(&local_340,&local_360,"\">");
    VRDataQueueItem::serialize_abi_cxx11_(&local_380,(VRDataQueueItem *)&p_Var2[1]._M_left);
    std::operator+(&local_3e0,&local_340,&local_380);
    std::operator+(&local_3c0,&local_3e0,"</VRDataQueueItem>");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&timeStamp);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lenStr);
  return __return_storage_ptr__;
}

Assistant:

VRDataQueue::serialData VRDataQueue::serialize() {

  std::ostringstream lenStr;
  lenStr << _dataMap.size();

  VRDataQueue::serialData out;

  out = "<VRDataQueue num=\"" + lenStr.str() + "\">";
  for (VRDataList::iterator it = _dataMap.begin(); it != _dataMap.end(); ++it) {
    std::ostringstream timeStamp;
    timeStamp << it->first.first << "-" << std::setfill('0') << std::setw(3) << it->first.second;
    out += "<VRDataQueueItem timeStamp=\"" + timeStamp.str() + "\">" +
      it->second.serialize() + "</VRDataQueueItem>";
  }
  out += "</VRDataQueue>";

  return out;
}